

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpDebugOut.c
# Opt level: O2

void printFmt(MessageType type,char *format,__va_list_tag *args)

{
  FILE *__s;
  
  __s = _stderr;
  if (type != MESSAGETYPE_ERROR) {
    vfprintf(_stdout,format,args);
    return;
  }
  fwrite("FATAL ERROR: ",0xd,1,_stderr);
  vfprintf(__s,format,args);
  putc(10,__s);
  fflush(__s);
  return;
}

Assistant:

void printFmt (MessageType type, const char* format, va_list args)
{
	FILE* out = getOutFile(type);

	if (type == MESSAGETYPE_ERROR)
		fprintf(out, "FATAL ERROR: ");

	vfprintf(out, format, args);

	if (type == MESSAGETYPE_ERROR)
	{
		putc('\n', out);
		fflush(out);
	}
}